

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1285::run(TestCase1285 *this)

{
  word **this_00;
  bool bVar1;
  __off_t __length;
  uint local_200 [2];
  bool local_1f5;
  uint local_1f4;
  int iStack_1f0;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  uint local_1c0;
  uint i;
  bool local_1b5;
  uint local_1b4;
  int iStack_1b0;
  bool _kj_shouldLog;
  DebugExpression<int> local_1ac;
  undefined1 local_1a8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  Builder local_148;
  undefined1 local_120 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder message;
  TestCase1285 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_148,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,&local_148);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::truncate
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,(char *)0x3,__length);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&_kjCondition.result,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  iStack_1b0 = 3;
  local_1ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe50);
  local_1b4 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_1a8,&local_1ac,&local_1b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    local_1b5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b5 != false) {
      i = 3;
      local_1c0 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x50c,ERROR,
                 "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
                 (char (*) [40])"failed: expected (3) == (reader.size())",
                 (DebugComparison<int,_unsigned_int> *)local_1a8,(int *)&i,&local_1c0);
      local_1b5 = false;
    }
  }
  for (_kjCondition_1._28_4_ = 0; (uint)_kjCondition_1._28_4_ < 3;
      _kjCondition_1._28_4_ = _kjCondition_1._28_4_ + 1) {
    iStack_1f0 = 0;
    local_1ec = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe10);
    local_1f4 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition.result,_kjCondition_1._28_4_);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int> *)local_1e8,&local_1ec,&local_1f4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
    if (!bVar1) {
      local_1f5 = kj::_::Debug::shouldLog(ERROR);
      while (local_1f5 != false) {
        local_200[1] = 0;
        local_200[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                                 ((Reader *)&_kjCondition.result,_kjCondition_1._28_4_);
        kj::_::Debug::
        log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x50f,ERROR,
                   "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                   (char (*) [36])"failed: expected (0) == (reader[i])",
                   (DebugComparison<int,_unsigned_int> *)local_1e8,(int *)(local_200 + 1),local_200)
        ;
        local_1f5 = false;
      }
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownUInt32List();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}